

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O0

void __thiscall OpenMD::StatWriter::writeVector(StatWriter *this,int i)

{
  uint uVar1;
  double *pdVar2;
  undefined8 uVar3;
  ostream *poVar4;
  ostream *in_RDI;
  Vector3d s;
  undefined8 in_stack_ffffffffffffffa0;
  Stats *in_stack_ffffffffffffffa8;
  string local_48 [12];
  int in_stack_ffffffffffffffc4;
  Stats *in_stack_ffffffffffffffc8;
  Vector<double,_3U> local_28;
  
  Stats::getVectorData(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  pdVar2 = Vector<double,_3U>::operator[](&local_28,0);
  uVar1 = std::isinf(*pdVar2);
  if ((uVar1 & 1) == 0) {
    pdVar2 = Vector<double,_3U>::operator[](&local_28,0);
    uVar1 = std::isnan(*pdVar2);
    if ((uVar1 & 1) == 0) {
      pdVar2 = Vector<double,_3U>::operator[](&local_28,1);
      uVar1 = std::isinf(*pdVar2);
      if ((uVar1 & 1) == 0) {
        pdVar2 = Vector<double,_3U>::operator[](&local_28,1);
        uVar1 = std::isnan(*pdVar2);
        if ((uVar1 & 1) == 0) {
          pdVar2 = Vector<double,_3U>::operator[](&local_28,2);
          uVar1 = std::isinf(*pdVar2);
          if ((uVar1 & 1) == 0) {
            pdVar2 = Vector<double,_3U>::operator[](&local_28,2);
            uVar1 = std::isnan(*pdVar2);
            if ((uVar1 & 1) == 0) {
              poVar4 = std::operator<<(in_RDI,"\t");
              pdVar2 = Vector<double,_3U>::operator[](&local_28,0);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar2);
              poVar4 = std::operator<<(poVar4,"\t");
              pdVar2 = Vector<double,_3U>::operator[](&local_28,1);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar2);
              poVar4 = std::operator<<(poVar4,"\t");
              pdVar2 = Vector<double,_3U>::operator[](&local_28,2);
              std::ostream::operator<<(poVar4,*pdVar2);
              return;
            }
          }
        }
      }
    }
  }
  Stats::getTitle_abi_cxx11_
            (in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  uVar3 = std::__cxx11::string::c_str();
  snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s",uVar3);
  std::__cxx11::string::~string(local_48);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void StatWriter::writeVector(int i) {
    Vector3d s = stats_->getVectorData(i);
    if (std::isinf(s[0]) || std::isnan(s[0]) || std::isinf(s[1]) ||
        std::isnan(s[1]) || std::isinf(s[2]) || std::isnan(s[2])) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StatWriter detected a numerical error writing: %s",
               stats_->getTitle(i).c_str());
      painCave.isFatal = 1;
      simError();
    } else {
      statfile_ << "\t" << s[0] << "\t" << s[1] << "\t" << s[2];
    }
  }